

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecdhopt.c
# Opt level: O3

int mbedtls_ecdhopt_use_static_key
              (mbedtls_ecdhopt_context *octx,mbedtls_ecp_keypair *key,mbedtls_ecdhopt_side side)

{
  int iVar1;
  size_t olen;
  mbedtls_ecdhopt_x25519_context ctx;
  size_t local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  
  if ((key->grp).id != MBEDTLS_ECP_DP_CURVE25519) {
    iVar1 = mbedtls_ecdh_get_params(&(octx->ctx).ec,key,side);
    return iVar1;
  }
  local_50 = 0;
  local_48 = *(undefined8 *)&octx->ctx;
  uStack_40 = *(undefined8 *)((long)&octx->ctx + 8);
  local_38 = *(undefined8 *)((long)&octx->ctx + 0x10);
  uStack_30 = *(undefined8 *)((long)&octx->ctx + 0x18);
  local_28 = *(undefined8 *)((long)&octx->ctx + 0x20);
  uStack_20 = *(undefined8 *)((long)&octx->ctx + 0x28);
  local_18 = *(undefined8 *)((long)&octx->ctx + 0x30);
  uStack_10 = *(undefined8 *)((long)&octx->ctx + 0x38);
  octx->curve = MBEDTLS_ECP_DP_CURVE25519;
  if (side == MBEDTLS_ECDH_OURS) {
    mbedtls_mpi_write_binary(&key->d,(uchar *)&local_48,0x20);
  }
  else {
    if (side != MBEDTLS_ECDH_THEIRS) {
      return -0x4f80;
    }
    mbedtls_ecp_point_write_binary(&key->grp,&key->Q,1,&local_50,(uchar *)&local_28,0x20);
  }
  return -0x4e80;
}

Assistant:

int mbedtls_ecdhopt_use_static_key( mbedtls_ecdhopt_context *octx,
                      const mbedtls_ecp_keypair *key, mbedtls_ecdhopt_side side )
{
    if( key->grp.id == MBEDTLS_ECP_DP_CURVE25519 )
    {
        size_t olen = 0;
        mbedtls_ecdhopt_x25519_context ctx = octx->ctx.x25519;
        octx->curve = MBEDTLS_ECP_DP_CURVE25519;

        switch( side ) {
        case MBEDTLS_ECDH_THEIRS:
            mbedtls_ecp_point_write_binary( &key->grp, &key->Q, MBEDTLS_ECP_PF_COMPRESSED, &olen, ctx.peer_point, 32 );
            // untested; defensively throw an error for now.
            return(MBEDTLS_ERR_ECP_FEATURE_UNAVAILABLE);
        case MBEDTLS_ECDH_OURS:
            mbedtls_mpi_write_binary( &key->d, ctx.our_secret, 32 );
            // key->Q = key->d * base; do we need to set up ctx.peer_point here?
            // untested; defensively throw an error for now.
            return( MBEDTLS_ERR_ECP_FEATURE_UNAVAILABLE );
        default:
            return( MBEDTLS_ERR_ECP_BAD_INPUT_DATA );
        }
    }
    else
    {
        return mbedtls_ecdh_get_params( &octx->ctx.ec, key, side );
    }
}